

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O2

bool __thiscall ROM::Request::Node::subtract(Node *this,Map *map)

{
  const_iterator cVar1;
  iterator __position;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  
  if (this->type == One) {
    cVar1 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&map->_M_t,&this->name);
    bVar4 = (_Rb_tree_header *)cVar1._M_node != &(map->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    __position._M_current =
         (this->children).
         super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
         super__Vector_impl_data._M_start;
    bVar3 = 1;
    bVar2 = 0;
    while (__position._M_current !=
           (this->children).
           super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      bVar4 = subtract(__position._M_current,map);
      bVar3 = bVar3 & bVar4;
      bVar2 = bVar2 | bVar4;
      if (bVar4) {
        __position = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::erase
                               (&this->children,__position._M_current);
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    }
    bVar4 = true;
    if ((this->type == All & bVar3) == 0) {
      bVar4 = (bool)(this->type == Any & bVar2);
    }
  }
  return bVar4;
}

Assistant:

bool Request::Node::subtract(const ROM::Map &map) {
	switch(type) {
		case Type::One:
		return map.find(name) != map.end();

		default: {
			bool has_all = true;
			bool has_any = false;

			auto iterator = children.begin();
			while(iterator != children.end()) {
				const bool did_subtract = iterator->subtract(map);
				has_all &= did_subtract;
				has_any |= did_subtract;
				if(did_subtract) {
					iterator = children.erase(iterator);
				} else {
					++iterator;
				}
			}

			return (type == Type::All && has_all) || (type == Type::Any && has_any);
		}
	}
}